

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

fxp_name * fxp_dup_name(fxp_name *name)

{
  fxp_name *pfVar1;
  char *pcVar2;
  fxp_name *ret;
  fxp_name *name_local;
  
  pfVar1 = (fxp_name *)safemalloc(1,0x48,0);
  pcVar2 = dupstr(name->filename);
  pfVar1->filename = pcVar2;
  pcVar2 = dupstr(name->longname);
  pfVar1->longname = pcVar2;
  memcpy(&pfVar1->attrs,&name->attrs,0x38);
  return pfVar1;
}

Assistant:

struct fxp_name *fxp_dup_name(struct fxp_name *name)
{
    struct fxp_name *ret;
    ret = snew(struct fxp_name);
    ret->filename = dupstr(name->filename);
    ret->longname = dupstr(name->longname);
    ret->attrs = name->attrs;          /* structure copy */
    return ret;
}